

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_statement.cpp
# Opt level: O1

string * __thiscall
duckdb::InsertStatement::OnConflictActionToString_abi_cxx11_
          (string *__return_storage_ptr__,InsertStatement *this,OnConflictAction action)

{
  int iVar1;
  NotImplementedException *this_00;
  undefined7 in_register_00000011;
  char *pcVar2;
  char *pcVar3;
  string local_40;
  
  iVar1 = (int)this;
  if (iVar1 - 2U < 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "DO UPDATE";
    pcVar2 = "";
  }
  else if (iVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = anon_var_dwarf_643533f + 9;
    pcVar3 = anon_var_dwarf_643533f + 9;
  }
  else {
    if (iVar1 != 1) {
      this_00 = (NotImplementedException *)
                __cxa_allocate_exception(0x10,this,CONCAT71(in_register_00000011,action));
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"type not implemented for OnConflictActionType","");
      NotImplementedException::NotImplementedException(this_00,&local_40);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "DO NOTHING";
    pcVar2 = "";
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

string InsertStatement::OnConflictActionToString(OnConflictAction action) {
	switch (action) {
	case OnConflictAction::NOTHING:
		return "DO NOTHING";
	case OnConflictAction::REPLACE:
	case OnConflictAction::UPDATE:
		return "DO UPDATE";
	case OnConflictAction::THROW:
		// Explicitly left empty, for ToString purposes
		return "";
	default: {
		throw NotImplementedException("type not implemented for OnConflictActionType");
	}
	}
}